

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::AddVisibilityPresetFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang)

{
  pointer pcVar1;
  cmake *this_00;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  TargetType TVar4;
  PolicyStatus PVar5;
  int iVar6;
  undefined8 *puVar7;
  char *pcVar8;
  char *__s1;
  ostream *poVar9;
  string *psVar10;
  size_t sVar11;
  cmLocalGenerator *pcVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  PolicyID id;
  _Alloc_hider _Var14;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar15;
  string compileOption;
  string flagDefine;
  string warnCMP0063;
  string option;
  cmGeneratorTarget *local_240;
  char **local_238;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string *local_1d0;
  char *local_1c8;
  long local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  if (lang->_M_string_length == 0) {
    return;
  }
  local_1c8 = &local_1b8;
  local_1c0 = 0;
  local_1b8 = '\0';
  local_240 = target;
  local_1d0 = flags;
  TVar4 = cmGeneratorTarget::GetType(target);
  if (((TVar4 == SHARED_LIBRARY) ||
      (TVar4 = cmGeneratorTarget::GetType(local_240), TVar4 == MODULE_LIBRARY)) ||
     (bVar3 = cmGeneratorTarget::IsExecutableWithExports(local_240), bVar3)) {
LAB_00354009:
    local_238 = (char **)0x0;
  }
  else {
    PVar5 = cmPolicies::PolicyMap::Get(&local_240->PolicyMap,CMP0063);
    if (PVar5 == OLD) goto LAB_00354797;
    if (PVar5 != WARN) goto LAB_00354009;
    local_238 = &local_1c8;
  }
  pcVar2 = local_240;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 "CMAKE_",lang);
  puVar7 = (undefined8 *)std::__cxx11::string::append(local_1a8);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  pcVar8 = (char *)(puVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar8) {
    local_230.field_2._M_allocated_capacity = *(undefined8 *)pcVar8;
    local_230.field_2._8_8_ = puVar7[3];
  }
  else {
    local_230.field_2._M_allocated_capacity = *(undefined8 *)pcVar8;
    local_230._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_230._M_string_length = puVar7[1];
  *puVar7 = pcVar8;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
  }
  pcVar8 = cmMakefile::GetDefinition(this->Makefile,&local_230);
  if (pcVar8 != (char *)0x0) {
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    pcVar1 = (lang->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,pcVar1,pcVar1 + lang->_M_string_length);
    std::__cxx11::string::append((char *)&local_210);
    __s1 = cmGeneratorTarget::GetProperty(pcVar2,&local_210);
    if (__s1 != (char *)0x0) {
      if (local_238 == (char **)0x0) {
        iVar6 = strcmp(__s1,"hidden");
        if (((iVar6 == 0) || (iVar6 = strcmp(__s1,"default"), iVar6 == 0)) ||
           ((iVar6 = strcmp(__s1,"protected"), iVar6 == 0 ||
            (iVar6 = strcmp(__s1,"internal"), iVar6 == 0)))) {
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          sVar11 = strlen(pcVar8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f0,pcVar8,pcVar8 + sVar11);
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 == paVar13) {
            local_198[0]._0_8_ = paVar13->_M_allocated_capacity;
            local_198[0]._8_8_ = puVar7[3];
            local_1a8._0_8_ = local_198;
          }
          else {
            local_198[0]._0_8_ = paVar13->_M_allocated_capacity;
            local_1a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar7;
          }
          local_1a8._8_8_ = puVar7[1];
          *puVar7 = paVar13;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,
                            (ulong)(local_1f0.field_2._M_allocated_capacity + 1));
          }
          (*this->_vptr_cmLocalGenerator[6])(this,local_1d0,local_1a8);
          local_1f0.field_2._M_allocated_capacity = local_198[0]._M_allocated_capacity;
          _Var14._M_p = (pointer)local_1a8._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._0_8_ != local_198) goto LAB_00354405;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target ",7);
          psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar2);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(psVar10->_M_dataplus)._M_p,
                              psVar10->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," uses unsupported value \"",0x19);
          sVar11 = strlen(__s1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,__s1,sVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" for ",6);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_210._M_dataplus._M_p,local_210._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(local_1f0._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,
                            (ulong)(local_1f0.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      else {
        std::operator+(&local_1f0,"  ",&local_210);
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 == paVar13) {
          local_198[0]._0_8_ = paVar13->_M_allocated_capacity;
          local_198[0]._8_8_ = puVar7[3];
          local_1a8._0_8_ = local_198;
        }
        else {
          local_198[0]._0_8_ = paVar13->_M_allocated_capacity;
          local_1a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar7;
        }
        local_1a8._8_8_ = puVar7[1];
        *puVar7 = paVar13;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_238,local_1a8._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
        }
        _Var14._M_p = local_1f0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
LAB_00354405:
          operator_delete(_Var14._M_p,(ulong)(local_1f0.field_2._M_allocated_capacity + 1));
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
  }
  paVar13 = &local_230.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar13) {
    operator_delete(local_230._M_dataplus._M_p,(ulong)(local_230.field_2._M_allocated_capacity + 1))
    ;
  }
  iVar6 = std::__cxx11::string::compare((char *)lang);
  pcVar2 = local_240;
  if (iVar6 == 0) {
    local_230._M_dataplus._M_p = (pointer)0x33;
    local_1a8._0_8_ = local_198;
    local_1a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1a8,(ulong)&local_230);
    local_198[0]._M_allocated_capacity = local_230._M_dataplus._M_p;
    *(char *)(local_1a8._0_8_ + 0x20) = 'L';
    *(char *)(local_1a8._0_8_ + 0x21) = 'I';
    *(char *)(local_1a8._0_8_ + 0x22) = 'T';
    *(char *)(local_1a8._0_8_ + 0x23) = 'Y';
    *(char *)(local_1a8._0_8_ + 0x24) = '_';
    *(char *)(local_1a8._0_8_ + 0x25) = 'I';
    *(char *)(local_1a8._0_8_ + 0x26) = 'N';
    *(char *)(local_1a8._0_8_ + 0x27) = 'L';
    *(char *)(local_1a8._0_8_ + 0x28) = 'I';
    *(char *)(local_1a8._0_8_ + 0x29) = 'N';
    *(char *)(local_1a8._0_8_ + 0x2a) = 'E';
    *(char *)(local_1a8._0_8_ + 0x2b) = 'S';
    *(char *)(local_1a8._0_8_ + 0x2c) = '_';
    *(char *)(local_1a8._0_8_ + 0x2d) = 'H';
    *(char *)(local_1a8._0_8_ + 0x2e) = 'I';
    *(char *)(local_1a8._0_8_ + 0x2f) = 'D';
    *(char *)(local_1a8._0_8_ + 0x10) = 'E';
    *(char *)(local_1a8._0_8_ + 0x11) = '_';
    *(char *)(local_1a8._0_8_ + 0x12) = 'O';
    *(char *)(local_1a8._0_8_ + 0x13) = 'P';
    *(char *)(local_1a8._0_8_ + 0x14) = 'T';
    *(char *)(local_1a8._0_8_ + 0x15) = 'I';
    *(char *)(local_1a8._0_8_ + 0x16) = 'O';
    *(char *)(local_1a8._0_8_ + 0x17) = 'N';
    *(char *)(local_1a8._0_8_ + 0x18) = 'S';
    *(char *)(local_1a8._0_8_ + 0x19) = '_';
    *(char *)(local_1a8._0_8_ + 0x1a) = 'V';
    *(char *)(local_1a8._0_8_ + 0x1b) = 'I';
    *(char *)(local_1a8._0_8_ + 0x1c) = 'S';
    *(char *)(local_1a8._0_8_ + 0x1d) = 'I';
    *(char *)(local_1a8._0_8_ + 0x1e) = 'B';
    *(char *)(local_1a8._0_8_ + 0x1f) = 'I';
    *(undefined8 *)local_1a8._0_8_ = 0x58435f454b414d43;
    *(char *)(local_1a8._0_8_ + 8) = 'X';
    *(char *)(local_1a8._0_8_ + 9) = '_';
    *(char *)(local_1a8._0_8_ + 10) = 'C';
    *(char *)(local_1a8._0_8_ + 0xb) = 'O';
    *(char *)(local_1a8._0_8_ + 0xc) = 'M';
    *(char *)(local_1a8._0_8_ + 0xd) = 'P';
    *(char *)(local_1a8._0_8_ + 0xe) = 'I';
    *(char *)(local_1a8._0_8_ + 0xf) = 'L';
    *(char *)(local_1a8._0_8_ + 0x2f) = 'D';
    *(char *)(local_1a8._0_8_ + 0x30) = 'D';
    *(char *)(local_1a8._0_8_ + 0x31) = 'E';
    *(char *)(local_1a8._0_8_ + 0x32) = 'N';
    local_1a8._8_8_ = local_230._M_dataplus._M_p;
    *(char *)(local_1a8._0_8_ + (long)local_230._M_dataplus._M_p) = '\0';
    pcVar8 = cmMakefile::GetDefinition(this->Makefile,(string *)local_1a8);
    if (pcVar8 != (char *)0x0) {
      local_210._M_dataplus._M_p = (pointer)0x19;
      local_230._M_dataplus._M_p = (pointer)paVar13;
      local_230._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_230,(ulong)&local_210);
      local_230.field_2._M_allocated_capacity = (size_type)local_210._M_dataplus._M_p;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 9) = 'Y';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 10) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0xb) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0xc) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0xd) = 'L';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0xe) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0xf) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0x10) = 'E';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0x11) = 'S';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0x12) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0x13) = 'H';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0x14) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0x15) = 'D';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0x16) = 'D';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0x17) = 'E';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0x18) = 'N';
      *(undefined8 *)local_230._M_dataplus._M_p = 0x494c494249534956;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 8) = 'T';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 9) = 'Y';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 10) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0xb) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0xc) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0xd) = 'L';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0xe) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p + 0xf) = 'N';
      local_230._M_string_length = (size_type)local_210._M_dataplus._M_p;
      local_230._M_dataplus._M_p[(long)local_210._M_dataplus._M_p] = '\0';
      bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar13) {
        operator_delete(local_230._M_dataplus._M_p,
                        (ulong)(local_230.field_2._M_allocated_capacity + 1));
      }
      if (bVar3) {
        if (local_238 == (char **)0x0) {
          (*this->_vptr_cmLocalGenerator[7])(this,local_1d0,pcVar8);
        }
        else {
          std::__cxx11::string::append((char *)local_238);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._M_allocated_capacity + 1));
    }
  }
  if ((local_1c0 != 0) &&
     (pVar15 = std::
               _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
               ::_M_insert_unique<cmGeneratorTarget_const*const&>
                         ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                           *)&this->WarnCMP0063,&local_240),
     ((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_230,(cmPolicies *)0x3f,id);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nTarget \"",9);
    psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(local_240);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(psVar10->_M_dataplus)._M_p,psVar10->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" of type \"",0xb);
    TVar4 = cmGeneratorTarget::GetType(local_240);
    pcVar8 = cmState::GetTargetTypeName(TVar4);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)poVar9->_vptr_basic_ostream[-3]);
    }
    else {
      sVar11 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar8,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"\" has the following visibility properties set for ",0x32);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,":\n",2);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_1c8,local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"For compatibility CMake is not honoring them for this target.",0x3d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar13) {
      operator_delete(local_230._M_dataplus._M_p,
                      (ulong)(local_230.field_2._M_allocated_capacity + 1));
    }
    pcVar12 = cmGeneratorTarget::GetLocalGenerator(local_240);
    this_00 = pcVar12->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace((cmListFileBacktrace *)&local_210,local_240);
    cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_230,(cmListFileBacktrace *)&local_210);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar13) {
      operator_delete(local_230._M_dataplus._M_p,
                      (ulong)(local_230.field_2._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
LAB_00354797:
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddVisibilityPresetFlags(
  std::string& flags, cmGeneratorTarget const* target, const std::string& lang)
{
  if (lang.empty()) {
    return;
  }

  std::string warnCMP0063;
  std::string* pWarnCMP0063 = CM_NULLPTR;
  if (target->GetType() != cmStateEnums::SHARED_LIBRARY &&
      target->GetType() != cmStateEnums::MODULE_LIBRARY &&
      !target->IsExecutableWithExports()) {
    switch (target->GetPolicyStatusCMP0063()) {
      case cmPolicies::OLD:
        return;
      case cmPolicies::WARN:
        pWarnCMP0063 = &warnCMP0063;
        break;
      default:
        break;
    }
  }

  AddVisibilityCompileOption(flags, target, this, lang, pWarnCMP0063);

  if (lang == "CXX") {
    AddInlineVisibilityCompileOption(flags, target, this, pWarnCMP0063);
  }

  if (!warnCMP0063.empty() && this->WarnCMP0063.insert(target).second) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0063) << "\n"
      "Target \"" << target->GetName() << "\" of "
      "type \"" << cmState::GetTargetTypeName(target->GetType()) << "\" "
      "has the following visibility properties set for " << lang << ":\n" <<
      warnCMP0063 <<
      "For compatibility CMake is not honoring them for this target.";
    /* clang-format on */
    target->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
      cmake::AUTHOR_WARNING, w.str(), target->GetBacktrace());
  }
}